

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

bool __thiscall ClipperLib::Clipper::IsTopHorz(Clipper *this,long64 XPos)

{
  long lVar1;
  long lVar2;
  TEdge *pTVar3;
  long lVar4;
  long64 *plVar5;
  bool bVar6;
  
  pTVar3 = this->m_SortedEdges;
  do {
    bVar6 = pTVar3 == (TEdge *)0x0;
    if (bVar6) {
      return bVar6;
    }
    lVar1 = pTVar3->xcurr;
    lVar2 = pTVar3->xtop;
    lVar4 = lVar1;
    if (lVar2 < lVar1) {
      lVar4 = lVar2;
    }
    if (lVar4 <= XPos) {
      plVar5 = &pTVar3->xcurr;
      if (lVar1 < lVar2) {
        plVar5 = &pTVar3->xtop;
      }
      if (XPos <= *plVar5) {
        return bVar6;
      }
    }
    pTVar3 = pTVar3->nextInSEL;
  } while( true );
}

Assistant:

bool Clipper::IsTopHorz(const long64 XPos)
{
  TEdge* e = m_SortedEdges;
  while( e )
  {
    if(  ( XPos >= std::min(e->xcurr, e->xtop) ) &&
      ( XPos <= std::max(e->xcurr, e->xtop) ) ) return false;
    e = e->nextInSEL;
  }
  return true;
}